

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_base_foreach_event_nolock_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  common_timeout_list *pcVar5;
  event *peVar6;
  
  iVar1 = evmap_foreach_event_(base,fn,arg);
  if (iVar1 == 0) {
    for (uVar4 = 0; uVar4 < (base->timeheap).n; uVar4 = uVar4 + 1) {
      peVar6 = (base->timeheap).p[uVar4];
      if ((((peVar6->ev_evcallback).evcb_flags & 2) == 0) &&
         (iVar1 = (*fn)(base,peVar6,arg), iVar1 != 0)) {
        return iVar1;
      }
    }
    for (lVar3 = 0; lVar3 < base->n_common_timeouts; lVar3 = lVar3 + 1) {
      pcVar5 = base->common_timeout_queues[lVar3];
      while (peVar6 = (pcVar5->events).tqh_first, peVar6 != (event *)0x0) {
        if ((((peVar6->ev_evcallback).evcb_flags & 2) == 0) &&
           (iVar1 = (*fn)(base,peVar6,arg), iVar1 != 0)) {
          return iVar1;
        }
        pcVar5 = (common_timeout_list *)&peVar6->ev_timeout_pos;
      }
    }
    iVar1 = 0;
    for (lVar3 = 0; lVar3 < base->nactivequeues; lVar3 = lVar3 + 1) {
      peVar6 = (event *)(base->activequeues + lVar3);
      while (peVar6 = (event *)(peVar6->ev_evcallback).evcb_active_next.tqe_next,
            peVar6 != (event *)0x0) {
        if (((peVar6->ev_evcallback).evcb_flags & 0x83U) == 0x80) {
          event_callback_to_event((event_callback *)peVar6);
          iVar2 = (*fn)(base,peVar6,arg);
          if (iVar2 != 0) {
            return iVar2;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int
event_base_foreach_event_nolock_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	int r, i;
	unsigned u;
	struct event *ev;

	/* Start out with all the EVLIST_INSERTED events. */
	if ((r = evmap_foreach_event_(base, fn, arg)))
		return r;

	/* Okay, now we deal with those events that have timeouts and are in
	 * the min-heap. */
	for (u = 0; u < base->timeheap.n; ++u) {
		ev = base->timeheap.p[u];
		if (ev->ev_flags & EVLIST_INSERTED) {
			/* we already processed this one */
			continue;
		}
		if ((r = fn(base, ev, arg)))
			return r;
	}

	/* Now for the events in one of the timeout queues.
	 * the min-heap. */
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		TAILQ_FOREACH(ev, &ctl->events,
		    ev_timeout_pos.ev_next_with_common_timeout) {
			if (ev->ev_flags & EVLIST_INSERTED) {
				/* we already processed this one */
				continue;
			}
			if ((r = fn(base, ev, arg)))
				return r;
		}
	}

	/* Finally, we deal wit all the active events that we haven't touched
	 * yet. */
	for (i = 0; i < base->nactivequeues; ++i) {
		struct event_callback *evcb;
		TAILQ_FOREACH(evcb, &base->activequeues[i], evcb_active_next) {
			if ((evcb->evcb_flags & (EVLIST_INIT|EVLIST_INSERTED|EVLIST_TIMEOUT)) != EVLIST_INIT) {
				/* This isn't an event (evlist_init clear), or
				 * we already processed it. (inserted or
				 * timeout set */
				continue;
			}
			ev = event_callback_to_event(evcb);
			if ((r = fn(base, ev, arg)))
				return r;
		}
	}

	return 0;
}